

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::RadioButton(char *label,bool active)

{
  float fVar1;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id_00;
  ImU32 IVar5;
  ImGuiWindow *this;
  float fVar6;
  ImVec2 IVar7;
  char *local_140;
  ImGuiCol local_104;
  float local_e4;
  ImVec2 local_bc;
  ImVec2 label_pos;
  ImVec2 local_ac;
  float local_a4;
  byte local_9f;
  bool local_9e;
  bool local_9d;
  float pad;
  bool pressed;
  bool held;
  float fStack_98;
  bool hovered;
  float radius;
  ImVec2 center;
  ImVec2 local_88;
  undefined1 local_80 [8];
  ImRect total_bb;
  ImVec2 local_68;
  undefined1 local_60 [8];
  ImRect check_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool active_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar7 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar6 = GetFrameHeight();
    check_bb.Max = (this->DC).CursorPos;
    ImVec2::ImVec2(&total_bb.Max,fVar6,fVar6);
    local_68 = ::operator+(&check_bb.Max,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_60,&check_bb.Max,&local_68);
    pos.y = IVar7.x;
    if (pos.y <= 0.0) {
      local_e4 = 0.0;
    }
    else {
      local_e4 = (pIVar3->Style).ItemInnerSpacing.x + pos.y;
    }
    square_sz = IVar7.y;
    fVar1 = (pIVar3->Style).FramePadding.y;
    ImVec2::ImVec2(&center,fVar6 + local_e4,fVar1 + fVar1 + square_sz);
    local_88 = ::operator+(&check_bb.Max,&center);
    ImRect::ImRect((ImRect *)local_80,&check_bb.Max,&local_88);
    ItemSize((ImRect *)local_80,(pIVar3->Style).FramePadding.y);
    bVar4 = ItemAdd((ImRect *)local_80,id_00,(ImRect *)0x0,0);
    if (bVar4) {
      IVar7 = ImRect::GetCenter((ImRect *)local_60);
      fStack_98 = IVar7.x;
      radius = IVar7.y;
      radius = (float)(int)(radius + 0.5);
      fStack_98 = (float)(int)(fStack_98 + 0.5);
      pad = (fVar6 - 1.0) * 0.5;
      local_9f = ButtonBehavior((ImRect *)local_80,id_00,&local_9d,&local_9e,0);
      if ((bool)local_9f) {
        MarkItemEdited(id_00);
      }
      RenderNavHighlight((ImRect *)local_80,id_00,1);
      fVar1 = pad;
      pIVar2 = this->DrawList;
      if (((local_9e & 1U) == 0) || ((local_9d & 1U) == 0)) {
        local_104 = 7;
        if ((local_9d & 1U) != 0) {
          local_104 = 8;
        }
      }
      else {
        local_104 = 9;
      }
      IVar5 = GetColorU32(local_104,1.0);
      ImDrawList::AddCircleFilled(pIVar2,(ImVec2 *)&stack0xffffffffffffff68,fVar1,IVar5,0x10);
      if (active) {
        local_a4 = ImMax<float>(1.0,(float)(int)(fVar6 / 6.0));
        pIVar2 = this->DrawList;
        fVar6 = pad - local_a4;
        IVar5 = GetColorU32(0x12,1.0);
        ImDrawList::AddCircleFilled(pIVar2,(ImVec2 *)&stack0xffffffffffffff68,fVar6,IVar5,0x10);
      }
      if (0.0 < (pIVar3->Style).FrameBorderSize) {
        pIVar2 = this->DrawList;
        ImVec2::ImVec2(&label_pos,1.0,1.0);
        local_ac = ::operator+((ImVec2 *)&stack0xffffffffffffff68,&label_pos);
        fVar6 = pad;
        IVar5 = GetColorU32(6,1.0);
        ImDrawList::AddCircle(pIVar2,&local_ac,fVar6,IVar5,0x10,(pIVar3->Style).FrameBorderSize);
        fVar6 = pad;
        pIVar2 = this->DrawList;
        IVar5 = GetColorU32(5,1.0);
        ImDrawList::AddCircle
                  (pIVar2,(ImVec2 *)&stack0xffffffffffffff68,fVar6,IVar5,0x10,
                   (pIVar3->Style).FrameBorderSize);
      }
      ImVec2::ImVec2(&local_bc,check_bb.Min.x + (pIVar3->Style).ItemInnerSpacing.x,
                     (float)local_60._4_4_ + (pIVar3->Style).FramePadding.y);
      if ((pIVar3->LogEnabled & 1U) != 0) {
        if (active) {
          local_140 = "(x)";
        }
        else {
          local_140 = "( )";
        }
        LogRenderedText(&local_bc,local_140,(char *)0x0);
      }
      if (0.0 < pos.y) {
        RenderText(local_bc,label,(char *)0x0,true);
      }
      label_local._7_1_ = (bool)(local_9f & 1);
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::RadioButton(const char* label, bool active)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
        return false;

    ImVec2 center = check_bb.GetCenter();
    center.x = IM_ROUND(center.x);
    center.y = IM_ROUND(center.y);
    const float radius = (square_sz - 1.0f) * 0.5f;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
        MarkItemEdited(id);

    RenderNavHighlight(total_bb, id);
    window->DrawList->AddCircleFilled(center, radius, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), 16);
    if (active)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        window->DrawList->AddCircleFilled(center, radius - pad, GetColorU32(ImGuiCol_CheckMark), 16);
    }

    if (style.FrameBorderSize > 0.0f)
    {
        window->DrawList->AddCircle(center + ImVec2(1, 1), radius, GetColorU32(ImGuiCol_BorderShadow), 16, style.FrameBorderSize);
        window->DrawList->AddCircle(center, radius, GetColorU32(ImGuiCol_Border), 16, style.FrameBorderSize);
    }

    ImVec2 label_pos = ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y);
    if (g.LogEnabled)
        LogRenderedText(&label_pos, active ? "(x)" : "( )");
    if (label_size.x > 0.0f)
        RenderText(label_pos, label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return pressed;
}